

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_ss.c
# Opt level: O3

gdIOCtx * gdNewSSCtx(gdSourcePtr src,gdSinkPtr snk)

{
  gdIOCtx *pgVar1;
  
  pgVar1 = (gdIOCtx *)gdMalloc(0x50);
  if (pgVar1 != (gdIOCtx *)0x0) {
    pgVar1[1].getC = (_func_int_gdIOCtx_ptr *)src;
    pgVar1[1].getBuf = (_func_int_gdIOCtx_ptr_void_ptr_int *)snk;
    pgVar1->getC = sourceGetchar;
    pgVar1->getBuf = sourceGetbuf;
    pgVar1->putC = sinkPutchar;
    pgVar1->putBuf = sinkPutbuf;
    pgVar1->seek = (_func_int_gdIOCtx_ptr_int *)0x0;
    pgVar1->tell = (_func_long_gdIOCtx_ptr *)0x0;
    pgVar1->gd_free = gdFreeSsCtx;
  }
  return pgVar1;
}

Assistant:

BGD_DECLARE(gdIOCtx *) gdNewSSCtx(gdSourcePtr src, gdSinkPtr snk)
{
	ssIOCtxPtr ctx;

	ctx = (ssIOCtxPtr)gdMalloc(sizeof (ssIOCtx));
	if (ctx == NULL) {
		return NULL;
	}

	ctx->src = src;
	ctx->snk = snk;

	ctx->ctx.getC = sourceGetchar;
	ctx->ctx.getBuf = sourceGetbuf;

	ctx->ctx.putC = sinkPutchar;
	ctx->ctx.putBuf = sinkPutbuf;

	ctx->ctx.tell = NULL;
	ctx->ctx.seek = NULL;

	ctx->ctx.gd_free = gdFreeSsCtx;

	return (gdIOCtx *)ctx;
}